

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DateTruncBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  DatePartSpecifier DVar1;
  int iVar2;
  reference pvVar3;
  pointer pEVar4;
  type expr;
  reference pvVar5;
  undefined **ppuVar6;
  NotImplementedException *pNVar7;
  uint uVar8;
  allocator local_a9;
  string local_a8;
  string part_name;
  Value part_value;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar4);
  if ((char)iVar2 == '\0') {
    *(undefined8 *)this = 0;
  }
  else {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar3);
    ExpressionExecutor::EvaluateScalar(&part_value,context,expr,false);
    if (part_value.is_null == true) {
      *(undefined8 *)this = 0;
    }
    else {
      Value::ToString_abi_cxx11_(&part_name,&part_value);
      DVar1 = GetDatePartSpecifier(&part_name);
      uVar8 = (uint)DVar1;
      if ((DVar1 < BEGIN_INVALID) && ((0x83f83fU >> (uVar8 & 0x1f) & 1) != 0)) {
        pvVar5 = vector<duckdb::LogicalType,_true>::get<true>
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,1);
        if (pvVar5->id_ == DATE) {
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    &bound_function->function,DateTruncFunction<duckdb::date_t,duckdb::date_t>);
          if ((JULIAN_DAY < DVar1) || ((0xc3ffffU >> (uVar8 & 0x1f) & 1) == 0)) {
            pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_a8,"Specifier type not implemented for DATETRUNC statistics"
                       ,&local_a9);
            NotImplementedException::NotImplementedException(pNVar7,&local_a8);
            __cxa_throw(pNVar7,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ppuVar6 = &
                    PTR_PropagateDateTruncStatistics<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>_017b2000
          ;
        }
        else {
          if (pvVar5->id_ != TIMESTAMP) {
            pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_a8,"Temporal argument type for DATETRUNC",&local_a9);
            NotImplementedException::NotImplementedException(pNVar7,&local_a8);
            __cxa_throw(pNVar7,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    &bound_function->function,DateTruncFunction<duckdb::timestamp_t,duckdb::date_t>)
          ;
          if ((JULIAN_DAY < DVar1) || ((0xc3ffffU >> (DVar1 & 0x1f) & 1) == 0)) {
            pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_a8,"Specifier type not implemented for DATETRUNC statistics"
                       ,&local_a9);
            NotImplementedException::NotImplementedException(pNVar7,&local_a8);
            __cxa_throw(pNVar7,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ppuVar6 = &
                    PTR_PropagateDateTruncStatistics<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>_017b1f40
          ;
        }
        bound_function->statistics = (function_statistics_t)ppuVar6[(char)DVar1];
        LogicalType::LogicalType((LogicalType *)&local_a8,DATE);
        LogicalType::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type,(LogicalType *)&local_a8)
        ;
        LogicalType::~LogicalType((LogicalType *)&local_a8);
      }
      else {
        pvVar5 = vector<duckdb::LogicalType,_true>::get<true>
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,1);
        if (pvVar5->id_ == DATE) {
          if ((JULIAN_DAY < DVar1) || ((0xc3ffc3U >> (DVar1 & 0x1f) & 1) == 0)) {
            pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_a8,"Specifier type not implemented for DATETRUNC statistics"
                       ,&local_a9);
            NotImplementedException::NotImplementedException(pNVar7,&local_a8);
            __cxa_throw(pNVar7,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ppuVar6 = &
                    PTR_PropagateDateTruncStatistics<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>_017b2180
          ;
        }
        else {
          if (pvVar5->id_ != TIMESTAMP) {
            pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_a8,"Temporal argument type for DATETRUNC",&local_a9);
            NotImplementedException::NotImplementedException(pNVar7,&local_a8);
            __cxa_throw(pNVar7,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          if ((JULIAN_DAY < DVar1) || ((0xc3ffc3U >> (uVar8 & 0x1f) & 1) == 0)) {
            pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_a8,"Specifier type not implemented for DATETRUNC statistics"
                       ,&local_a9);
            NotImplementedException::NotImplementedException(pNVar7,&local_a8);
            __cxa_throw(pNVar7,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          ppuVar6 = &
                    PTR_PropagateDateTruncStatistics<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>_017b20c0
          ;
        }
        bound_function->statistics = (function_statistics_t)ppuVar6[DVar1];
      }
      *(undefined8 *)this = 0;
      ::std::__cxx11::string::~string((string *)&part_name);
    }
    Value::~Value(&part_value);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> DateTruncBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	if (!arguments[0]->IsFoldable()) {
		return nullptr;
	}

	// Rebind to return a date if we are truncating that far
	Value part_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	if (part_value.IsNull()) {
		return nullptr;
	}
	const auto part_name = part_value.ToString();
	const auto part_code = GetDatePartSpecifier(part_name);
	switch (part_code) {
	case DatePartSpecifier::MILLENNIUM:
	case DatePartSpecifier::CENTURY:
	case DatePartSpecifier::DECADE:
	case DatePartSpecifier::YEAR:
	case DatePartSpecifier::QUARTER:
	case DatePartSpecifier::MONTH:
	case DatePartSpecifier::WEEK:
	case DatePartSpecifier::YEARWEEK:
	case DatePartSpecifier::ISOYEAR:
	case DatePartSpecifier::DAY:
	case DatePartSpecifier::DOW:
	case DatePartSpecifier::ISODOW:
	case DatePartSpecifier::DOY:
	case DatePartSpecifier::JULIAN_DAY:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.function = DateTruncFunction<timestamp_t, date_t>;
			bound_function.statistics = DateTruncStats<timestamp_t, date_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.function = DateTruncFunction<date_t, date_t>;
			bound_function.statistics = DateTruncStats<date_t, date_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		bound_function.return_type = LogicalType::DATE;
		break;
	default:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.statistics = DateTruncStats<timestamp_t, timestamp_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.statistics = DateTruncStats<date_t, timestamp_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		break;
	}

	return nullptr;
}